

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cpp
# Opt level: O3

void __thiscall kiste::parse_context::update(parse_context *this,line_data_t *line_data)

{
  char cVar1;
  line_type lVar2;
  size_type sVar3;
  pointer psVar4;
  bool bVar5;
  size_t sVar6;
  parse_error *this_00;
  size_type sVar7;
  
  lVar2 = line_data->_type;
  sVar6 = this->_curly_level;
  if (lVar2 == cpp) {
    sVar3 = (this->_line)._M_string_length;
    if (sVar3 != 0) {
      sVar7 = 0;
      do {
        cVar1 = (this->_line)._M_dataplus._M_p[sVar7];
        if (cVar1 == '}') {
          if (sVar6 == 0) {
            this_00 = (parse_error *)__cxa_allocate_exception(0x10);
            parse_error::parse_error(this_00,"Too many closing curly braces in C++");
            __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sVar6 = sVar6 - 1;
        }
        else if (cVar1 == '{') {
          sVar6 = sVar6 + 1;
        }
        sVar7 = sVar7 + 1;
      } while (sVar3 != sVar7);
      goto LAB_00107fd5;
    }
    sVar6 = this->_class_curly_level;
LAB_0010800e:
    this->_class_curly_level = sVar6;
  }
  else {
LAB_00107fd5:
    this->_curly_level = sVar6;
    if (lVar2 != text) {
      if (lVar2 == class_end) {
        sVar6 = 0;
      }
      else if (lVar2 != class_begin) goto LAB_00108011;
      goto LAB_0010800e;
    }
    psVar4 = (line_data->_segments).
             super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((line_data->_segments).
         super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
         super__Vector_impl_data._M_start != psVar4) && (psVar4[-1]._type == trim_trailing_return))
    {
      bVar5 = false;
      goto LAB_00108013;
    }
  }
LAB_00108011:
  bVar5 = true;
LAB_00108013:
  this->_has_trailing_return = bVar5;
  return;
}

Assistant:

auto parse_context::update(const line_data_t& line_data) -> void
  {
    _curly_level = determine_curly_level(*this, line_data);
    _class_curly_level = determine_class_curly_level(*this, line_data);
    _has_trailing_return = ::kiste::has_trailing_return(line_data);
  }